

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O3

Vec_Int_t * Gia_ManSimDeriveResets(Gia_Man_t *pGia)

{
  Gia_Obj_t *pObj;
  int *piVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  undefined8 uVar4;
  int iVar5;
  long lVar6;
  void *__s;
  Vec_Int_t *pVVar7;
  int *piVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  Gia_Obj_t *pGVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  timespec ts;
  timespec local_48;
  long local_38;
  
  iVar5 = clock_gettime(3,&local_48);
  if (iVar5 < 0) {
    lVar10 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  lVar6 = (long)pGia->nObjs;
  iVar5 = (int)(lVar6 * 2);
  iVar16 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar16 = iVar5;
  }
  local_38 = lVar6;
  if (iVar16 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar16 << 2);
  }
  iVar22 = 0;
  memset(__s,0,lVar6 << 3);
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(4000);
  pVVar7->pArray = piVar8;
  iVar16 = pGia->nRegs;
  if (0 < iVar16) {
    do {
      iVar2 = pGia->vCos->nSize;
      uVar9 = (iVar2 - iVar16) + iVar22;
      if (((int)uVar9 < 0) || (iVar2 <= (int)uVar9)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar9 = pGia->vCos->pArray[uVar9];
      if (((long)(int)uVar9 < 0) || (pGia->nObjs <= (int)uVar9)) goto LAB_0071d7ff;
      pGVar3 = pGia->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar12 = *(ulong *)(pGVar3 + (int)uVar9);
      uVar14 = (uint)uVar12;
      if (uVar9 != (uVar14 & 0x1fffffff)) {
        pObj = pGVar3 + (int)uVar9 + -(ulong)(uVar14 & 0x1fffffff);
        pGVar18 = (Gia_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
        if ((pGVar18 < pGVar3) || (pGVar3 + (uint)pGia->nObjs <= pGVar18)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar16 = (int)((ulong)((long)pGVar18 - (long)pGVar3) >> 2);
        if (iVar16 * -0x55555555 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10b,"int Abc_Var2Lit(int, int)");
        }
        uVar9 = (((uint)(uVar12 >> 0x1d) ^ (uint)pObj) & 1) + iVar16 * 0x55555556;
        if (iVar5 <= (int)uVar9) {
LAB_0071d7e0:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        piVar8 = (int *)((long)__s + (ulong)uVar9 * 4);
        *piVar8 = *piVar8 + 1;
        Gia_ManSimCollect(pGia,pObj,pVVar7);
        iVar16 = pVVar7->nSize;
        if (0 < (long)iVar16) {
          piVar8 = pVVar7->pArray;
          lVar11 = 0;
          do {
            iVar2 = piVar8[lVar11];
            if (((long)iVar2 < 0) || (iVar5 <= iVar2)) goto LAB_0071d7e0;
            piVar1 = (int *)((long)__s + (long)iVar2 * 4);
            *piVar1 = *piVar1 + 1;
            lVar11 = lVar11 + 1;
          } while (iVar16 != lVar11);
        }
      }
      iVar22 = iVar22 + 1;
      iVar16 = pGia->nRegs;
    } while (iVar22 < iVar16);
    piVar8 = pVVar7->pArray;
  }
  if (piVar8 != (int *)0x0) {
    free(piVar8);
  }
  free(pVVar7);
  iVar5 = pGia->nObjs;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar16 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar16 = iVar5;
  }
  pVVar7->nCap = iVar16;
  if (iVar16 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar16 << 2);
  }
  pVVar7->pArray = piVar8;
  pVVar7->nSize = iVar5;
  memset(piVar8,0xff,(long)iVar5 << 2);
  if ((int)local_38 < 1) {
    uVar20 = 0;
    uVar19 = 0;
    uVar9 = 0;
    uVar21 = 0;
    uVar14 = 0;
    uVar13 = 0;
    uVar12 = 0;
    uVar15 = 0;
    if (__s == (void *)0x0) goto LAB_0071d73b;
  }
  else {
    uVar12 = 0;
    uVar19 = 0;
    uVar9 = 0;
    uVar21 = 0;
    uVar14 = 0;
    do {
      if (4 < *(int *)((long)__s + uVar12 * 4)) {
        uVar13 = uVar12 >> 1 & 0x7fffffff;
        if (iVar5 <= (int)uVar13) {
LAB_0071d7ff:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar3 = pGia->pObjs;
        if ((uVar12 & 1) == 0) {
          piVar8[uVar13] = 1;
          uVar4 = *(undefined8 *)(pGVar3 + uVar13);
          uVar17 = 0;
          if (((uint)uVar4 & 0x9fffffff) == 0x9fffffff) {
            uVar17 = (uint)((int)((uint)((ulong)uVar4 >> 0x20) & 0x1fffffff) <
                           pGia->vCis->nSize - pGia->nRegs);
          }
          uVar19 = uVar19 + uVar17;
          uVar21 = uVar21 + 1;
        }
        else {
          piVar8[uVar13] = 0;
          uVar4 = *(undefined8 *)(pGVar3 + uVar13);
          uVar17 = 0;
          if (((uint)uVar4 & 0x9fffffff) == 0x9fffffff) {
            uVar17 = (uint)((int)((uint)((ulong)uVar4 >> 0x20) & 0x1fffffff) <
                           pGia->vCis->nSize - pGia->nRegs);
          }
          uVar9 = uVar9 + uVar17;
          uVar14 = uVar14 + 1;
        }
      }
      uVar12 = uVar12 + 1;
    } while ((lVar6 * 2 & 0xffffffffU) != uVar12);
  }
  uVar20 = (ulong)uVar19;
  free(__s);
  uVar13 = (ulong)uVar9;
  uVar12 = (ulong)uVar21;
  uVar15 = (ulong)uVar14;
LAB_0071d73b:
  printf("Logic0 = %d (%d). Logic1 = %d (%d). ",uVar15,uVar13,uVar12,uVar20);
  iVar16 = 3;
  iVar5 = clock_gettime(3,&local_48);
  if (iVar5 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  Abc_Print(iVar16,"%s =","Time");
  Abc_Print(iVar16,"%9.2f sec\n",(double)(lVar6 + lVar10) / 1000000.0);
  return pVVar7;
}

Assistant:

Vec_Int_t * Gia_ManSimDeriveResets( Gia_Man_t * pGia )
{
    int nImpLimit = 5;
    Vec_Int_t * vResult;
    Vec_Int_t * vCountLits, * vSuperGate;
    Gia_Obj_t * pObj;
    int i, k, Lit, Count;
    int Counter0 = 0, Counter1 = 0;
    int CounterPi0 = 0, CounterPi1 = 0;
    abctime clk = Abc_Clock();

    // create reset counters for each literal
    vCountLits = Vec_IntStart( 2 * Gia_ManObjNum(pGia) );

    // collect implications for each flop input driver
    vSuperGate = Vec_IntAlloc( 1000 );
    Gia_ManForEachRi( pGia, pObj, i )
    {
        if ( Gia_ObjFaninId0p(pGia, pObj) == 0 )
            continue;
        Vec_IntAddToEntry( vCountLits, Gia_ObjToLit(pGia, Gia_ObjChild0(pObj)), 1 );
        Gia_ManSimCollect( pGia, Gia_ObjFanin0(pObj), vSuperGate );
        Vec_IntForEachEntry( vSuperGate, Lit, k )
            Vec_IntAddToEntry( vCountLits, Lit, 1 );
    }
    Vec_IntFree( vSuperGate );

    // label signals whose counter if more than the limit
    vResult = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    Vec_IntForEachEntry( vCountLits, Count, Lit )
    {
        if ( Count < nImpLimit )
            continue;
        pObj = Gia_ManObj( pGia, Abc_Lit2Var(Lit) );
        if ( Abc_LitIsCompl(Lit) ) // const 0
        {
//            Ssm_ObjSetLogic0( pObj );
            Vec_IntWriteEntry( vResult, Abc_Lit2Var(Lit), 0 );
            CounterPi0 += Gia_ObjIsPi(pGia, pObj);
            Counter0++;
        }
        else
        {
//            Ssm_ObjSetLogic1( pObj );
            Vec_IntWriteEntry( vResult, Abc_Lit2Var(Lit), 1 );
            CounterPi1 += Gia_ObjIsPi(pGia, pObj);
            Counter1++;
        }
//        if ( Gia_ObjIsPi(pGia, pObj) )
//            printf( "%d ", Count );
    }
//    printf( "\n" );
    Vec_IntFree( vCountLits );

    printf( "Logic0 = %d (%d). Logic1 = %d (%d). ", Counter0, CounterPi0, Counter1, CounterPi1 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return vResult;
}